

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cc
# Opt level: O2

Result wabt::ParseUint64(char *s,char *end,uint64_t *out)

{
  Result RVar1;
  uint uVar2;
  ulong in_RAX;
  ulong uVar3;
  Enum EVar4;
  ulong uVar5;
  undefined8 uStack_38;
  uint32_t digit;
  
  EVar4 = Error;
  if (s != end) {
    if (((*s == '0') && (s + 1 < end)) && (s[1] == 'x')) {
      s = s + 2;
      if (s == end) {
        return (Result)Error;
      }
      uVar5 = 0;
      uStack_38 = in_RAX;
      for (; s < end; s = s + 1) {
        uVar3 = uVar5;
        if (*s != '_') {
          RVar1 = ParseHexdigit(*s,(uint32_t *)((long)&uStack_38 + 4));
          if (RVar1.enum_ == Error) {
            return (Result)Error;
          }
          uVar3 = (uStack_38 >> 0x20) + uVar5 * 0x10;
          if (uVar3 < uVar5) {
            return (Result)Error;
          }
        }
        uVar5 = uVar3;
      }
    }
    else {
      uVar5 = 0;
      for (; s < end; s = s + 1) {
        uVar3 = uVar5;
        if (*s != 0x5f) {
          uVar2 = (int)*s - 0x30;
          if (9 < uVar2) {
            return (Result)Error;
          }
          uVar3 = (ulong)uVar2 + uVar5 * 10;
          if (uVar3 < uVar5) {
            return (Result)Error;
          }
        }
        uVar5 = uVar3;
      }
    }
    if (s == end) {
      *out = uVar5;
      EVar4 = Ok;
    }
  }
  return (Result)EVar4;
}

Assistant:

Result ParseUint64(const char* s, const char* end, uint64_t* out) {
  if (s == end) {
    return Result::Error;
  }
  uint64_t value = 0;
  if (*s == '0' && s + 1 < end && s[1] == 'x') {
    s += 2;
    if (s == end) {
      return Result::Error;
    }
    for (; s < end; ++s) {
      uint32_t digit;
      if (*s == '_') {
        continue;
      }
      CHECK_RESULT(ParseHexdigit(*s, &digit));
      uint64_t old_value = value;
      value = value * 16 + digit;
      // Check for overflow.
      if (old_value > value) {
        return Result::Error;
      }
    }
  } else {
    for (; s < end; ++s) {
      if (*s == '_') {
        continue;
      }
      uint32_t digit = (*s - '0');
      if (digit > 9) {
        return Result::Error;
      }
      uint64_t old_value = value;
      value = value * 10 + digit;
      // Check for overflow.
      if (old_value > value) {
        return Result::Error;
      }
    }
  }
  if (s != end) {
    return Result::Error;
  }
  *out = value;
  return Result::Ok;
}